

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O1

string * __thiscall
inja::DataNode::convert_dot_to_ptr_abi_cxx11_
          (string *__return_storage_ptr__,DataNode *this,string_view ptr_name)

{
  void *pvVar1;
  ulong uVar2;
  DataNode *pDVar3;
  size_type __n;
  void *__s;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __s = (void *)ptr_name._M_len;
  do {
    if (this == (DataNode *)0x0) {
      uVar2 = 0xffffffffffffffff;
    }
    else {
      pvVar1 = memchr(__s,0x2e,(size_t)this);
      uVar2 = -(ulong)(pvVar1 == (void *)0x0) | (long)pvVar1 - (long)__s;
    }
    if (uVar2 == 0xffffffffffffffff) {
      pvVar1 = (void *)0x0;
      this = (DataNode *)0x0;
    }
    else {
      pDVar3 = (DataNode *)(uVar2 + 1);
      if (this < uVar2 + 1) {
        pDVar3 = this;
      }
      this = (DataNode *)((long)this - (long)pDVar3);
      pvVar1 = (void *)((long)&(pDVar3->super_ExpressionNode).super_AstNode._vptr_AstNode +
                       (long)__s);
    }
    ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    ::std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,(char *)0x0,
               (ulong)__s);
    __s = pvVar1;
  } while (this != (DataNode *)0x0);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert_dot_to_ptr(std::string_view ptr_name) {
    std::string result;
    do {
      std::string_view part;
      std::tie(part, ptr_name) = string_view::split(ptr_name, '.');
      result.push_back('/');
      result.append(part.begin(), part.end());
    } while (!ptr_name.empty());
    return result;
  }